

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void int_linear_reif<1>(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  LinearNE<2,_3,_1> *this;
  LinearGE<1,_1> *pLVar1;
  undefined8 extraout_RAX;
  ulong uVar2;
  vec<int> b;
  vec<int> local_d8;
  int local_c4;
  BoolView local_c0;
  BoolView local_b0;
  BoolView local_a0;
  BoolView local_90;
  BoolView local_80;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  local_d8.sz = 0;
  local_d8.cap = 0;
  local_d8.data = (int *)0x0;
  if (a->sz != 0) {
    uVar2 = 0;
    do {
      local_c4 = -a->data[uVar2];
      vec<int>::push(&local_d8,&local_c4);
      uVar2 = uVar2 + 1;
    } while (uVar2 < a->sz);
  }
  switch(t) {
  case IRT_EQ:
    pLVar1 = (LinearGE<1,_1> *)operator_new(0x88);
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_40.v = r->v;
    local_40.s = r->s;
    LinearGE<1,_1>::LinearGE(pLVar1,a,x,c,&local_40);
    pLVar1 = (LinearGE<1,_1> *)operator_new(0x88);
    local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_50.v = r->v;
    local_50.s = r->s;
    LinearGE<1,_1>::LinearGE(pLVar1,&local_d8,x,-c,&local_50);
    this = (LinearNE<2,_3,_1> *)operator_new(0x58);
    local_60.v = r->v;
    local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_60.s = (bool)(r->s ^ 1);
    LinearNE<2,_3,_1>::LinearNE(this,a,x,c,&local_60);
    break;
  case IRT_NE:
    local_70.v = r->v;
    local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_70.s = (bool)(r->s ^ 1);
    int_linear_reif<1>(a,x,IRT_EQ,c,&local_70);
    break;
  case IRT_LE:
    local_80.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_80.v = r->v;
    local_80.s = r->s;
    int_linear_reif<1>(&local_d8,x,IRT_GE,-c,&local_80);
    break;
  case IRT_LT:
    local_90.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_90.v = r->v;
    local_90.s = r->s;
    int_linear_reif<1>(&local_d8,x,IRT_GE,1 - c,&local_90);
    break;
  case IRT_GE:
    pLVar1 = (LinearGE<1,_1> *)operator_new(0x88);
    local_a0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_a0.v = r->v;
    local_a0.s = r->s;
    LinearGE<1,_1>::LinearGE(pLVar1,a,x,c,&local_a0);
    pLVar1 = (LinearGE<1,_1> *)operator_new(0x88);
    local_b0.v = r->v;
    local_b0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_b0.s = (bool)(r->s ^ 1);
    LinearGE<1,_1>::LinearGE(pLVar1,&local_d8,x,1 - c,&local_b0);
    break;
  case IRT_GT:
    local_c0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
    local_c0.v = r->v;
    local_c0.s = r->s;
    int_linear_reif<1>(a,x,IRT_GE,c + 1,&local_c0);
    break;
  default:
    int_linear_reif<1>();
    operator_delete((void *)(ulong)t);
    if (local_d8.data != (int *)0x0) {
      free(local_d8.data);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (local_d8.data != (int *)0x0) {
    free(local_d8.data);
  }
  return;
}

Assistant:

void int_linear_reif(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, BoolView r) {
	vec<int> b;
	for (unsigned int i = 0; i < a.size(); i++) {
		b.push(-a[i]);
	}
	switch (t) {
		case IRT_EQ:
			new LinearGE<S, 1>(a, x, c, r);
			new LinearGE<S, 1>(b, x, -c, r);
			new LinearNE<2 * S, 2 * S + 1, 1>(a, x, c, ~r);
			break;
		case IRT_NE:
			int_linear_reif<S>(a, x, IRT_EQ, c, ~r);
			break;
		case IRT_LE:
			int_linear_reif<S>(b, x, IRT_GE, -c, r);
			break;
		case IRT_LT:
			int_linear_reif<S>(b, x, IRT_GE, -c + 1, r);
			break;
		case IRT_GE:
			new LinearGE<S, 1>(a, x, c, r);
			new LinearGE<S, 1>(b, x, -c + 1, ~r);
			break;
		case IRT_GT:
			int_linear_reif<S>(a, x, IRT_GE, c + 1, r);
			break;
		default:
			NEVER;
	}
}